

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::BufferTextureStorageTestCase::deinitTestCaseIteration(BufferTextureStorageTestCase *this)

{
  GLenum GVar1;
  BufferTextureStorageTestCase *this_local;
  
  if (this->m_sparse_bo != 0) {
    (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x500);
    (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x504);
    this->m_sparse_bo = 0;
  }
  return;
}

Assistant:

void BufferTextureStorageTestCase::deinitTestCaseIteration()
{
	if (m_sparse_bo != 0)
	{
		m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

		m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,				  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		m_sparse_bo = 0;
	}
}